

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O1

token * __thiscall dh::scanner::getToken(token *__return_storage_ptr__,scanner *this)

{
  token *other;
  string local_38;
  
  if ((this->scanflag == false) ||
     (other = (this->_it)._M_current,
     (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
     super__Vector_impl_data._M_finish == other)) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
    token::token(__return_storage_ptr__,&local_38,NONES,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    token::token(__return_storage_ptr__,other);
    (this->_it)._M_current = (this->_it)._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

token scanner::getToken()
{
	if ( scanflag == false || _tokens.end() == _it)
	{
		return token( "", TYPE::NONES, 0);
	}

	// use copy constructrue function
	token tmp(*_it);

	// pointer point to next word
	++_it;

	return tmp;
}